

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void test<linq::IEnumerable<int>>(IEnumerable<int> *source)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  vector<int,_std::allocator<int>_> *source_00;
  vector<int,_std::allocator<int>_> *source_01;
  vector<int,_std::allocator<int>_> *source_02;
  vector<int,_std::allocator<int>_> *source_03;
  vector<int,_std::allocator<int>_> *source_04;
  int local_a44 [2];
  anon_class_1_0_00000001 local_a3c;
  anon_class_1_0_00000001_for_filter local_a3b;
  anon_class_1_0_00000001 local_a3a;
  anon_class_1_0_00000001_for_filter local_a39;
  IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
  local_a38;
  IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_9c8;
  IEnumerable<int> local_958;
  IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
  local_940;
  allocator<int> local_8c9;
  int local_8c8 [6];
  iterator local_8b0;
  size_type local_8a8;
  vector<int,_std::allocator<int>_> local_8a0;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_888;
  IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
  local_858;
  allocator<int> local_7c9;
  int local_7c8 [6];
  iterator local_7b0;
  size_type local_7a8;
  vector<int,_std::allocator<int>_> local_7a0;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_788;
  IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_758;
  allocator<int> local_6c9;
  int local_6c8 [6];
  iterator local_6b0;
  size_type local_6a8;
  vector<int,_std::allocator<int>_> local_6a0;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_688;
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_658;
  allocator<int> local_5c9;
  int local_5c8 [6];
  iterator local_5b0;
  size_type local_5a8;
  vector<int,_std::allocator<int>_> local_5a0;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_588;
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_558;
  allocator<int> local_4c9;
  int local_4c8 [6];
  iterator local_4b0;
  size_type local_4a8;
  vector<int,_std::allocator<int>_> local_4a0;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_488;
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
  local_458;
  anon_class_1_0_00000001_for_filter local_3ca;
  anon_class_1_0_00000001 local_3c9;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
  local_3c8;
  OUT local_350;
  anon_class_1_0_00000001 local_329;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
  local_328;
  OUT local_2b0;
  anon_class_1_0_00000001 local_289;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
  local_288;
  anon_class_1_0_00000001_for_filter local_209;
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>_>
  local_208;
  IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>,_int>_>
  local_1e0;
  anon_class_1_0_00000001_for_filter local_199;
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:20:35),_int>_>
  local_198;
  anon_class_1_0_00000001_for_filter local_169;
  IEnumerableCore<linq::SkipWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:19:39),_int>_>
  local_168;
  anon_class_1_0_00000001_for_filter local_139;
  IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:18:39),_int>_>
  local_138;
  anon_class_1_0_00000001_for_filter local_109;
  IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:17:39),_int>_>
  local_108;
  IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_> local_e0;
  IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_> local_b0;
  IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_> local_80;
  IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_> local_40;
  IEnumerable<int> *local_10;
  IEnumerable<int> *source_local;
  
  local_10 = source;
  iVar2 = linq::IEnumerable<int>::Min(source);
  assertEquals<int,int>(3,iVar2);
  iVar2 = linq::IEnumerable<int>::Max(source);
  assertEquals<int,int>(10,iVar2);
  sVar3 = linq::IEnumerable<int>::Count(source);
  assertEquals<int,unsigned_long>(8,sVar3);
  iVar2 = linq::IEnumerable<int>::Sum(source);
  assertEquals<int,int>(0x34,iVar2);
  linq::IEnumerable<int>::Take(&local_40,source,3);
  iVar2 = linq::IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_>::Min(&local_40);
  assertEquals<int,int>(3,iVar2);
  linq::IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_>::~IEnumerableCore(&local_40);
  linq::IEnumerable<int>::Take(&local_80,source,3);
  iVar2 = linq::IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_>::Max(&local_80);
  assertEquals<int,int>(5,iVar2);
  linq::IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_>::~IEnumerableCore(&local_80);
  linq::IEnumerable<int>::Skip(&local_b0,source,3);
  iVar2 = linq::IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_>::Min(&local_b0);
  assertEquals<int,int>(6,iVar2);
  linq::IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_>::~IEnumerableCore(&local_b0);
  linq::IEnumerable<int>::Skip(&local_e0,source,3);
  iVar2 = linq::IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_>::Max(&local_e0);
  assertEquals<int,int>(10,iVar2);
  linq::IEnumerableCore<linq::SkipState<linq::IEnumerable<int>,_int>_>::~IEnumerableCore(&local_e0);
  linq::IEnumerable<int>::
  TakeWhile<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_1_>
            (&local_108,source,&local_109);
  iVar2 = linq::
          IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:17:39),_int>_>
          ::Min(&local_108);
  assertEquals<int,int>(3,iVar2);
  linq::
  IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:17:39),_int>_>
  ::~IEnumerableCore(&local_108);
  linq::IEnumerable<int>::
  TakeWhile<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_2_>
            (&local_138,source,&local_139);
  iVar2 = linq::
          IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:18:39),_int>_>
          ::Max(&local_138);
  assertEquals<int,int>(4,iVar2);
  linq::
  IEnumerableCore<linq::TakeWhileState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:18:39),_int>_>
  ::~IEnumerableCore(&local_138);
  linq::IEnumerable<int>::
  SkipWhile<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_3_>
            (&local_168,source,&local_169);
  iVar2 = linq::
          IEnumerableCore<linq::SkipWhileState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:19:39),_int>_>
          ::Min(&local_168);
  assertEquals<int,int>(5,iVar2);
  linq::
  IEnumerableCore<linq::SkipWhileState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:19:39),_int>_>
  ::~IEnumerableCore(&local_168);
  linq::IEnumerable<int>::
  Where<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_4_>
            (&local_198,source,&local_199);
  sVar3 = linq::
          IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:20:35),_int>_>
          ::Count(&local_198);
  assertEquals<int,unsigned_long>(4,sVar3);
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:20:35),_int>_>
  ::~IEnumerableCore(&local_198);
  linq::IEnumerable<int>::
  Where<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_5_>
            (&local_208,source,&local_209);
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>_>
  ::Skip(&local_1e0,&local_208,1);
  iVar2 = linq::
          IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>,_int>_>
          ::First(&local_1e0);
  assertEquals<int,int>(6,iVar2);
  linq::
  IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>,_int>_>
  ::~IEnumerableCore(&local_1e0);
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>_>
  ::~IEnumerableCore(&local_208);
  linq::IEnumerable<int>::
  GroupBy<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_6_>
            (&local_288,source,&local_289);
  sVar3 = linq::
          IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
          ::Count(&local_288);
  assertEquals<int,unsigned_long>(2,sVar3);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::
  ~IEnumerableCore(&local_288);
  linq::IEnumerable<int>::
  GroupBy<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_7_>
            (&local_328,source,&local_329);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::
  First(&local_2b0,&local_328);
  sVar3 = linq::IEnumerable<int_&>::Count(&local_2b0.super_IEnumerable<int_&>);
  assertEquals<int,unsigned_long>(6,sVar3);
  linq::IGrouping<bool,_int_&>::~IGrouping(&local_2b0);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::
  ~IEnumerableCore(&local_328);
  linq::IEnumerable<int>::
  GroupBy<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_8_>
            (&local_3c8,source,&local_3c9);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::
  Last(&local_350,&local_3c8);
  sVar3 = linq::IEnumerable<int_&>::Count(&local_350.super_IEnumerable<int_&>);
  assertEquals<int,unsigned_long>(2,sVar3);
  linq::IGrouping<bool,_int_&>::~IGrouping(&local_350);
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::
  ~IEnumerableCore(&local_3c8);
  iVar2 = linq::IEnumerable<int>::
          Single<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_9_>
                    (source,&local_3ca);
  assertEquals<int,int>(5,iVar2);
  local_4c8[0] = 1;
  local_4c8[1] = 5;
  local_4c8[2] = 6;
  local_4c8[3] = 7;
  local_4c8[4] = 5;
  local_4b0 = local_4c8;
  local_4a8 = 5;
  std::allocator<int>::allocator(&local_4c9);
  __l_03._M_len = local_4a8;
  __l_03._M_array = local_4b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_4a0,__l_03,&local_4c9);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_488,(linq *)&local_4a0,source_00);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerable<int>&>
            (&local_458,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_488,source);
  iVar2 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Min(&local_458);
  assertEquals<int,int>(5,iVar2);
  linq::
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_458);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_488);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4a0);
  std::allocator<int>::~allocator(&local_4c9);
  local_5c8[0] = 1;
  local_5c8[1] = 5;
  local_5c8[2] = 6;
  local_5c8[3] = 7;
  local_5c8[4] = 5;
  local_5b0 = local_5c8;
  local_5a8 = 5;
  std::allocator<int>::allocator(&local_5c9);
  __l_02._M_len = local_5a8;
  __l_02._M_array = local_5b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_5a0,__l_02,&local_5c9);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_588,(linq *)&local_5a0,source_01);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerable<int>&>
            (&local_558,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_588,source);
  iVar2 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Max(&local_558);
  assertEquals<int,int>(7,iVar2);
  linq::
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_558);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_588);
  std::vector<int,_std::allocator<int>_>::~vector(&local_5a0);
  std::allocator<int>::~allocator(&local_5c9);
  local_6c8[0] = 1;
  local_6c8[1] = 5;
  local_6c8[2] = 6;
  local_6c8[3] = 7;
  local_6c8[4] = 5;
  local_6b0 = local_6c8;
  local_6a8 = 5;
  std::allocator<int>::allocator(&local_6c9);
  __l_01._M_len = local_6a8;
  __l_01._M_array = local_6b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_6a0,__l_01,&local_6c9);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_688,(linq *)&local_6a0,source_02);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerable<int>&>
            (&local_658,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_688,source);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count(&local_658);
  assertEquals<int,unsigned_long>(3,sVar3);
  linq::
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_658);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_688);
  std::vector<int,_std::allocator<int>_>::~vector(&local_6a0);
  std::allocator<int>::~allocator(&local_6c9);
  local_7c8[0] = 1;
  local_7c8[1] = 5;
  local_7c8[2] = 6;
  local_7c8[3] = 7;
  local_7c8[4] = 5;
  local_7b0 = local_7c8;
  local_7a8 = 5;
  std::allocator<int>::allocator(&local_7c9);
  __l_00._M_len = local_7a8;
  __l_00._M_array = local_7b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_7a0,__l_00,&local_7c9);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_788,(linq *)&local_7a0,source_03);
  linq::IEnumerable<int>::
  Intersect<linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>>
            (&local_758,source,&local_788);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count(&local_758);
  assertEquals<int,unsigned_long>(3,sVar3);
  linq::
  IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_758);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_788);
  std::vector<int,_std::allocator<int>_>::~vector(&local_7a0);
  std::allocator<int>::~allocator(&local_7c9);
  local_8c8[0] = 1;
  local_8c8[1] = 5;
  local_8c8[2] = 6;
  local_8c8[3] = 7;
  local_8c8[4] = 5;
  local_8b0 = local_8c8;
  local_8a8 = 5;
  std::allocator<int>::allocator(&local_8c9);
  __l._M_len = local_8a8;
  __l._M_array = local_8b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_8a0,__l,&local_8c9);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_888,(linq *)&local_8a0,source_04);
  linq::IEnumerable<int>::
  Except<linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>>
            (&local_858,source,&local_888);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count(&local_858);
  assertEquals<int,unsigned_long>(5,sVar3);
  linq::
  IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::~IEnumerableCore(&local_858);
  linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  ~IEnumerableCore(&local_888);
  std::vector<int,_std::allocator<int>_>::~vector(&local_8a0);
  std::allocator<int>::~allocator(&local_8c9);
  linq::IEnumerable<int>::Range(&local_958,5,9);
  linq::IEnumerable<int>::Except<linq::IEnumerable<int>>(&local_940,source,&local_958);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count(&local_940);
  assertEquals<int,unsigned_long>(3,sVar3);
  linq::
  IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::~IEnumerableCore(&local_940);
  linq::IEnumerable<int>::~IEnumerable(&local_958);
  linq::IEnumerable<int>::Intersect<linq::IEnumerable<int>&>(&local_9c8,source,source);
  sVar3 = linq::
          IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count(&local_9c8);
  assertEquals<int,unsigned_long>(8,sVar3);
  linq::
  IEnumerableCore<linq::IntersectState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::~IEnumerableCore(&local_9c8);
  linq::IEnumerable<int>::Except<linq::IEnumerable<int>&>(&local_a38,source,source);
  sVar3 = linq::
          IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count(&local_a38);
  assertEquals<int,unsigned_long>(0,sVar3);
  linq::
  IEnumerableCore<linq::ExceptState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::~IEnumerableCore(&local_a38);
  bVar1 = linq::IEnumerable<int>::Any(source);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::IEnumerable<int>::All(source);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::IEnumerable<int>::
          Any<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_10_>
                    (source,&local_a39);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::IEnumerable<int>::
          All<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_11_>
                    (source,&local_a3a);
  assertEquals<bool,bool>(false,bVar1);
  bVar1 = linq::IEnumerable<int>::
          Any<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_12_>
                    (source,&local_a3b);
  assertEquals<bool,bool>(false,bVar1);
  bVar1 = linq::IEnumerable<int>::
          All<test<linq::IEnumerable<int>>(linq::IEnumerable<int>)::_lambda(int)_13_>
                    (source,&local_a3c);
  assertEquals<bool,bool>(true,bVar1);
  local_a44[1] = 6;
  bVar1 = linq::IEnumerable<int>::Contains<int>(source,local_a44 + 1);
  assertEquals<bool,bool>(true,bVar1);
  local_a44[0] = 0x10;
  bVar1 = linq::IEnumerable<int>::Contains<int>(source,local_a44);
  assertEquals<bool,bool>(false,bVar1);
  return;
}

Assistant:

void test(S source)
{
	assertEquals(    3, source.Min());
	assertEquals(   10, source.Max());
	assertEquals(    8, source.Count());
	assertEquals(   52, source.Sum());
	assertEquals(    3, source.Take(3).Min());
	assertEquals(    5, source.Take(3).Max());
	assertEquals(    6, source.Skip(3).Min());
	assertEquals(   10, source.Skip(3).Max());
	assertEquals(    3, source.TakeWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.TakeWhile([](int x){ return x < 5; }).Max());
	assertEquals(    5, source.SkipWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.Where([](int x){ return x < 7; }).Count());
	assertEquals(    6, source.Where([](int x){ return x % 3 == 0; }).Skip(1).First());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Count());
	assertEquals(    6, source.GroupBy([](int x){ return x < 5; }).First().Count());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Last().Count());
	assertEquals(    5, source.Single([](int x){ return x == 5; }));
	assertEquals(    5, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Min());
	assertEquals(    7, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Max());
	assertEquals(    3, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Count());
	assertEquals(    3, source.Intersect(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    5, source.Except(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    3, source.Except(IEnumerable<int>::Range(5,9)).Count());
	assertEquals(    8, source.Intersect(source).Count());
	assertEquals(    0, source.Except(source).Count());
	assertEquals( true, source.Any());
	assertEquals( true, source.All());
	assertEquals( true, source.Any([](int x) { return x > 9; }));
	assertEquals(false, source.All([](int x) { return x > 9; }));
	assertEquals(false, source.Any([](int x) { return x > 10; }));
	assertEquals( true, source.All([](int x) { return x <= 10; }));
	assertEquals( true, source.Contains(6));
	assertEquals(false, source.Contains(16));
}